

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

int32 __thiscall nuraft::raft_server::get_dc_id(raft_server *this,int32 srv_id)

{
  _func_int *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var2;
  int iVar3;
  ptr<cluster_config> c_conf;
  _func_int **local_20;
  element_type *local_18;
  
  get_config((raft_server *)&stack0xffffffffffffffe0);
  pp_Var2 = local_20 + 7;
  do {
    pp_Var2 = (_func_int **)*pp_Var2;
    if (pp_Var2 == local_20 + 7) {
      iVar3 = -1;
      goto LAB_001f9f65;
    }
    p_Var1 = pp_Var2[2];
  } while (*(int *)p_Var1 != srv_id);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var2[3];
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = *(int *)(p_Var1 + 4);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    iVar3 = *(int *)(p_Var1 + 4);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_001f9f65:
  if (local_18 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  return iVar3;
}

Assistant:

int32 raft_server::get_dc_id(int32 srv_id) const {
    ptr<cluster_config> c_conf = get_config();
    ptr<srv_config> s_conf = c_conf->get_server(srv_id);
    if (!s_conf) return -1; // Not found.

    return s_conf->get_dc_id();
}